

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O2

unsigned_long gf2_matrix_times(unsigned_long *mat,unsigned_long vec)

{
  unsigned_long sum;
  
  sum = 0;
  for (; vec != 0; vec = vec >> 1) {
    if ((vec & 1) != 0) {
      sum = sum ^ *mat;
    }
    mat = mat + 1;
  }
  return sum;
}

Assistant:

local unsigned long gf2_matrix_times(mat, vec)
    unsigned long *mat;
    unsigned long vec;
{
    unsigned long sum;

    sum = 0;
    while (vec) {
        if (vec & 1)
            sum ^= *mat;
        vec >>= 1;
        mat++;
    }
    return sum;
}